

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManHasNoEquivs(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int v;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    return 1;
  }
  for (v = 0; v < p->nObjs; v = v + 1) {
    pGVar1 = Gia_ManObj(p,v);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    pGVar1 = Gia_ObjReprObj(p,v);
    if (pGVar1 != (Gia_Obj_t *)0x0) break;
  }
  return (int)(p->nObjs == v);
}

Assistant:

ABC_NAMESPACE_IMPL_START


/**Function*************************************************************

  Synopsis    [Returns 1 if AIG has dangling nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManHasNoEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->pReprs == NULL )
        return 1;
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    return i == Gia_ManObjNum(p);
}